

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O2

int x509v3_conf_name_matches(char *name,char *cmp)

{
  int iVar1;
  uint uVar2;
  size_t __n;
  
  __n = strlen(cmp);
  iVar1 = strncmp(name,cmp,__n);
  uVar2 = 0;
  if (iVar1 == 0) {
    uVar2 = (uint)(name[__n] == '.' || name[__n] == '\0');
  }
  return uVar2;
}

Assistant:

int x509v3_conf_name_matches(const char *name, const char *cmp) {
  // |name| must begin with |cmp|.
  size_t len = strlen(cmp);
  if (strncmp(name, cmp, len) != 0) {
    return 0;
  }
  // |name| must either be equal to |cmp| or begin with |cmp|, followed by '.'.
  return name[len] == '\0' || name[len] == '.';
}